

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

void __thiscall wallet::anon_unknown_5::WalletLoaderImpl::registerRpcs(WalletLoaderImpl *this)

{
  CRPCCommand *pCVar1;
  reference pvVar2;
  anon_class_16_2_06d101f8 *in_RDI;
  long in_FS_OFFSET;
  CRPCCommand *command;
  CRPCCommand *__end2;
  CRPCCommand *__begin2;
  Span<const_CRPCCommand> *__range2;
  Span<const_CRPCCommand> *in_stack_ffffffffffffff68;
  CRPCCommand **this_00;
  CRPCCommand *this_01;
  anon_class_16_2_06d101f8 *in_stack_ffffffffffffff80;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  CRPCCommand *local_48;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_30;
  Span<const_CRPCCommand> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = GetWalletRPCCommands();
  local_48 = Span<const_CRPCCommand>::begin(in_stack_ffffffffffffff68);
  pCVar1 = Span<const_CRPCCommand>::end(in_stack_ffffffffffffff68);
  for (; local_48 != pCVar1; local_48 = local_48 + 1) {
    this_00 = &in_RDI[10].command;
    local_30.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_48;
    std::__cxx11::list<CRPCCommand,std::allocator<CRPCCommand>>::
    emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&,wallet::(anonymous_namespace)::WalletLoaderImpl::registerRpcs()::_lambda(JSONRPCRequest_const&,UniValue&,bool)_1_,std::vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>const&,long_const&>
              ((list<CRPCCommand,_std::allocator<CRPCCommand>_> *)local_48,in_stack_ffffffffffffffa0
               ,in_stack_ffffffffffffff98,in_RDI,in_stack_ffffffffffffff88,
               (long *)in_stack_ffffffffffffff80);
    in_stack_ffffffffffffff80 = in_RDI + 9;
    this_01 = in_RDI->command;
    pvVar2 = _GLOBAL__N_1::std::__cxx11::list<CRPCCommand,_std::allocator<CRPCCommand>_>::back
                       ((list<CRPCCommand,_std::allocator<CRPCCommand>_> *)this_00);
    in_stack_ffffffffffffff88 = &local_30;
    (*(code *)(((tuple<interfaces::Handler_*,_std::default_delete<interfaces::Handler>_> *)
               &(this_01->category)._M_dataplus._M_p)->
              super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>
              ).super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl[0x2b]._vptr_Handler
    )(in_stack_ffffffffffffff88,this_01,pvVar2);
    std::
    vector<std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>,std::allocator<std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>>>
    ::emplace_back<std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>>
              ((vector<std::unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_>,_std::allocator<std::unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_>_>_>
                *)in_stack_ffffffffffffff88,
               (unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> *)
               in_stack_ffffffffffffff80);
    _GLOBAL__N_1::std::unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_>::
    ~unique_ptr((unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> *)
                this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void registerRpcs() override
    {
        for (const CRPCCommand& command : GetWalletRPCCommands()) {
            m_rpc_commands.emplace_back(command.category, command.name, [this, &command](const JSONRPCRequest& request, UniValue& result, bool last_handler) {
                JSONRPCRequest wallet_request = request;
                wallet_request.context = &m_context;
                return command.actor(wallet_request, result, last_handler);
            }, command.argNames, command.unique_id);
            m_rpc_handlers.emplace_back(m_context.chain->handleRpc(m_rpc_commands.back()));
        }
    }